

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O0

double AlphaVectorPruning::GetBeliefDiff
                 (vector<double,_std::allocator<double>_> *belief0,
                 vector<double,_std::allocator<double>_> *belief1)

{
  size_type sVar1;
  reference pvVar2;
  int in_ESI;
  int __x;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar3;
  Index j;
  double totalDiff;
  size_t nrStates;
  value_type in_stack_ffffffffffffffc8;
  undefined4 local_24;
  undefined8 local_20;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  local_20 = (vector<double,_std::allocator<double>_> *)0x0;
  for (local_24 = 0; local_24 < sVar1; local_24 = local_24 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (local_20,(size_type)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffc8 = *pvVar2;
    __x = in_ESI;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (local_20,(size_type)in_stack_ffffffffffffffc8);
    dVar3 = in_stack_ffffffffffffffc8 - *pvVar2;
    std::abs(__x);
    local_20 = (vector<double,_std::allocator<double>_> *)((double)local_20 + dVar3);
  }
  return (double)local_20;
}

Assistant:

double AlphaVectorPruning::GetBeliefDiff(vector<double> &belief0, vector<double> &belief1)
{
    size_t nrStates = belief0.size();
    double totalDiff = 0.0;

    for(Index j=0; j<nrStates; j++)
    {
        totalDiff = totalDiff + std::abs(belief0.at(j)-belief1.at(j));
    }

    return totalDiff;
}